

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

CURLcode Curl_waitfds_add_ps(curl_waitfds *cwfds,easy_pollset *ps)

{
  CURLcode CVar1;
  ushort local_2a;
  ulong uStack_28;
  short events;
  size_t i;
  easy_pollset *ps_local;
  curl_waitfds *cwfds_local;
  
  uStack_28 = 0;
  while( true ) {
    if (ps->num <= uStack_28) {
      return CURLE_OK;
    }
    local_2a = (ushort)((ps->actions[uStack_28] & 1) != 0);
    if ((ps->actions[uStack_28] & 2) != 0) {
      local_2a = local_2a | 4;
    }
    if ((local_2a != 0) &&
       (CVar1 = cwfds_add_sock(cwfds,ps->sockets[uStack_28],local_2a), CVar1 != CURLE_OK)) break;
    uStack_28 = uStack_28 + 1;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_waitfds_add_ps(struct curl_waitfds *cwfds,
                             struct easy_pollset *ps)
{
  size_t i;

  DEBUGASSERT(cwfds);
  DEBUGASSERT(ps);
  for(i = 0; i < ps->num; i++) {
    short events = 0;
    if(ps->actions[i] & CURL_POLL_IN)
      events |= CURL_WAIT_POLLIN;
    if(ps->actions[i] & CURL_POLL_OUT)
      events |= CURL_WAIT_POLLOUT;
    if(events) {
      if(cwfds_add_sock(cwfds, ps->sockets[i], events))
        return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}